

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void __thiscall Server::sendFriendList(Server *this)

{
  uint32_t friendNumber_00;
  Tox *pTVar1;
  long lVar2;
  allocator *paVar3;
  Server *pSVar4;
  FriendUpdateMode mode;
  undefined8 uStack_110;
  undefined1 auStack_108 [8];
  allocator *local_100;
  allocator *local_f8;
  allocator *local_f0;
  bool local_e1;
  uint32_t local_e0;
  bool local_d9;
  undefined1 *local_d8;
  Server *local_d0;
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [39];
  undefined1 local_71;
  int local_70;
  bool success;
  TOX_ERR_FRIEND_SEND_MESSAGE sendError;
  allocator local_59;
  string local_58 [36];
  uint32_t local_34;
  int local_30;
  uint32_t friendNumber;
  int i;
  bool redirectionIsLast;
  unsigned_long __vla_expr0;
  ulong local_18;
  size_t friendCount;
  Server *this_local;
  
  uStack_110 = 0x117db2;
  local_d0 = this;
  friendCount = (size_t)this;
  _i = tox_self_get_friend_list_size(this->tox);
  local_18 = _i;
  if (_i < 2) {
    uStack_110 = 0x117f8f;
    tox_friend_send_message(local_d0->tox,local_d0->redirectionFriendNumber,0,"32",2,&local_70);
    local_71 = local_70 == 0;
    if ((bool)local_71) {
      local_f8 = &local_99;
      uStack_110 = 0x117fb8;
      std::allocator<char>::allocator();
      uStack_110 = 0x117fd2;
      std::__cxx11::string::string(local_98,"Sent empty friend list message",local_f8);
      uStack_110 = 0x117fe7;
      writeToLog(local_d0,(string *)local_98);
      uStack_110 = 0x117ff5;
      std::__cxx11::string::~string(local_98);
      uStack_110 = 0x118001;
      std::allocator<char>::~allocator((allocator<char> *)&local_99);
    }
    else {
      local_100 = &local_c1;
      uStack_110 = 0x118050;
      std::allocator<char>::allocator();
      uStack_110 = 0x11806a;
      std::__cxx11::string::string(local_c0,"Failed to send empty friend list message",local_100);
      uStack_110 = 0x11807f;
      writeToLog(local_d0,(string *)local_c0);
      uStack_110 = 0x11808d;
      std::__cxx11::string::~string(local_c0);
      uStack_110 = 0x118099;
      std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    }
  }
  else {
    lVar2 = -(_i * 4 + 0xf & 0xfffffffffffffff0);
    local_d8 = auStack_108 + lVar2;
    pTVar1 = local_d0->tox;
    __vla_expr0 = (unsigned_long)auStack_108;
    *(undefined8 *)(auStack_108 + lVar2 + -8) = 0x117dfb;
    tox_self_get_friend_list(pTVar1);
    friendNumber._3_1_ =
         *(uint32_t *)(local_d8 + (local_18 - 1) * 4) == local_d0->redirectionFriendNumber;
    for (local_30 = 0; pSVar4 = local_d0, (ulong)(long)local_30 < local_18; local_30 = local_30 + 1)
    {
      friendNumber_00 = *(uint32_t *)(local_d8 + (long)local_30 * 4);
      local_34 = friendNumber_00;
      if (friendNumber_00 != local_d0->redirectionFriendNumber) {
        local_d9 = true;
        if ((long)local_30 != local_18 - 1) {
          local_e1 = (friendNumber._3_1_ & 1) != 0 && (long)local_30 == local_18 - 2;
          local_d9 = local_e1;
        }
        mode = FRIENDLIST_ITEM;
        if (local_d9 != false) {
          mode = FRIENDLIST_END;
        }
        local_e0 = friendNumber_00;
        *(undefined8 *)(auStack_108 + lVar2 + -8) = 0x117ed0;
        sendFriendUpdate(pSVar4,friendNumber_00,mode);
      }
    }
    local_f0 = &local_59;
    *(undefined8 *)(auStack_108 + lVar2 + -8) = 0x117ef0;
    std::allocator<char>::allocator();
    paVar3 = local_f0;
    *(undefined8 *)(auStack_108 + lVar2 + -8) = 0x117f07;
    std::__cxx11::string::string(local_58,"Sent friend list",paVar3);
    pSVar4 = local_d0;
    *(undefined8 *)(auStack_108 + lVar2 + -8) = 0x117f19;
    writeToLog(pSVar4,(string *)local_58);
    *(undefined8 *)(auStack_108 + lVar2 + -8) = 0x117f24;
    std::__cxx11::string::~string(local_58);
    *(undefined8 *)(auStack_108 + lVar2 + -8) = 0x117f2d;
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
  }
  return;
}

Assistant:

void Server::sendFriendList() {
    size_t friendCount = tox_self_get_friend_list_size(tox);

    if (friendCount > 1) { //When friendCount == 1, the only friend which exists is the client
        uint32_t friendList[friendCount];
        tox_self_get_friend_list(tox, friendList);

        bool redirectionIsLast = (friendList[friendCount - 1] == redirectionFriendNumber);

        for (int i = 0; i < friendCount; i++) {
            uint32_t friendNumber = friendList[i];

            if (friendNumber != redirectionFriendNumber) {
                sendFriendUpdate(friendNumber, (i == friendCount - 1 || (redirectionIsLast && i == friendCount - 2)) ? FRIENDLIST_END : FRIENDLIST_ITEM);
            }
        }

        writeToLog("Sent friend list");
    } else {
        TOX_ERR_FRIEND_SEND_MESSAGE sendError;
        tox_friend_send_message(tox, redirectionFriendNumber, TOX_MESSAGE_TYPE_NORMAL, (uint8_t *) "32", 2, &sendError);

        bool success = (sendError == TOX_ERR_FRIEND_SEND_MESSAGE_OK);

        if (success) {
            writeToLog("Sent empty friend list message");
        } else {
            writeToLog("Failed to send empty friend list message");
        }
    }
}